

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O2

UBool __thiscall
icu_63::UnicodeString::endsWith
          (UnicodeString *this,UnicodeString *srcText,int32_t srcStart,int32_t srcLength)

{
  short sVar1;
  int8_t iVar2;
  int iVar3;
  int local_18;
  int32_t local_14;
  
  local_18 = srcLength;
  local_14 = srcStart;
  pinIndices(srcText,&local_14,&local_18);
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  iVar2 = doCompare(this,iVar3 - local_18,local_18,srcText,local_14,local_18);
  return iVar2 == '\0';
}

Assistant:

inline UBool
UnicodeString::endsWith(const UnicodeString& srcText,
            int32_t srcStart,
            int32_t srcLength) const {
  srcText.pinIndices(srcStart, srcLength);
  return doCompare(length() - srcLength, srcLength,
                   srcText, srcStart, srcLength) == 0;
}